

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O0

void deblock_edge_chro_hor
               (pel *src,int stride,int alpha_u,int beta_u,int alpha_v,int beta_v,int edge_flag)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int delta_r;
  int delta_l;
  int delta_m;
  int R2;
  int R1;
  int R0;
  int L0;
  int L1;
  int L2;
  int uv;
  pel *p_src;
  int beta [2];
  int alpha [2];
  int inc3;
  int inc2;
  int inc;
  int line_size;
  int i;
  int beta_v_local;
  int alpha_v_local;
  int beta_u_local;
  int alpha_u_local;
  int stride_local;
  pel *src_local;
  
  inc2 = 4;
  beta[0] = alpha_u;
  beta[1] = alpha_v;
  if ((edge_flag & 0x202U) != 0x202) {
    inc2 = 2;
  }
  _alpha_u_local = src;
  if ((edge_flag & 2U) == 0) {
    _alpha_u_local = src + 4;
  }
  for (L1 = 0; L1 < 2; L1 = L1 + 1) {
    _L2 = _alpha_u_local + L1;
    for (inc = 0; inc < inc2; inc = inc + 1) {
      bVar1 = _L2[stride * -3];
      uVar3 = (uint)_L2[stride * -2];
      uVar4 = (uint)_L2[-stride];
      uVar5 = (uint)*_L2;
      uVar6 = (uint)_L2[stride];
      bVar2 = _L2[stride * 2];
      iVar7 = uVar5 - uVar4;
      if (iVar7 < 1) {
        iVar7 = -iVar7;
      }
      iVar8 = uVar3 - uVar4;
      if (iVar8 < 1) {
        iVar8 = -iVar8;
      }
      iVar9 = uVar5 - uVar6;
      if (iVar9 < 1) {
        iVar9 = -iVar9;
      }
      if ((iVar8 < beta[(long)L1 + -2]) && (iVar9 < beta[(long)L1 + -2])) {
        _L2[-stride] = (byte)((int)(uVar3 * 3 + uVar4 * 10 + uVar5 * 3 + 8) >> 4);
        *_L2 = (byte)((int)(uVar6 * 3 + uVar5 * 10 + uVar4 * 3 + 8) >> 4);
        iVar10 = bVar1 - uVar4;
        if (iVar10 < 1) {
          iVar10 = -iVar10;
        }
        if (iVar10 < beta[(long)L1 + -2]) {
          iVar10 = bVar2 - uVar5;
          if (iVar10 < 1) {
            iVar10 = -iVar10;
          }
          if ((((iVar10 < beta[(long)L1 + -2]) && (iVar9 <= beta[(long)L1 + -2] / 4)) &&
              (iVar8 <= beta[(long)L1 + -2] / 4)) && (iVar7 < beta[L1])) {
            _L2[stride * -2] =
                 (byte)((int)((uint)bVar1 * 3 + uVar3 * 8 + uVar4 * 3 + uVar5 * 2 + 8) >> 4);
            _L2[stride] = (byte)((int)((uint)bVar2 * 3 + uVar6 * 8 + uVar5 * 3 + uVar4 * 2 + 8) >> 4
                                );
          }
        }
      }
      _L2 = _L2 + 2;
    }
  }
  return;
}

Assistant:

void deblock_edge_chro_hor(pel *src, int stride, int alpha_u, int beta_u, int alpha_v, int beta_v, int edge_flag)
{
    int i, line_size = 4;
    int inc = stride;
    int inc2 = inc << 1;
    int inc3 = inc + inc2;
    int alpha[2] = { alpha_u, alpha_v };
    int beta[2] = { beta_u, beta_v };
    pel *p_src;
    int uv;

    if ((edge_flag & 0x0202) != 0x0202) {
        line_size = 2;
    }
    if (!(edge_flag & 0x2)) {
        src += 4;
    }

    for (uv = 0; uv < 2; uv++) {
        p_src = src + uv;
        for (i = 0; i < line_size; i++, p_src += 2) {
            int L2 = p_src[-inc3];
            int L1 = p_src[-inc2];
            int L0 = p_src[-inc];
            int R0 = p_src[0];
            int R1 = p_src[inc];
            int R2 = p_src[inc2];
            int delta_m = COM_ABS(R0 - L0);
            int delta_l = COM_ABS(L1 - L0);
            int delta_r = COM_ABS(R0 - R1);

            if ((delta_l < beta[uv]) && (delta_r < beta[uv])) {
                p_src[-inc] = (pel)((L1 * 3 + L0 * 10 + R0 * 3 + 8) >> 4);                  // L0
                p_src[0] = (pel)((R1 * 3 + R0 * 10 + L0 * 3 + 8) >> 4);                     // R0
                if ((COM_ABS(L2 - L0) < beta[uv]) && (COM_ABS(R2 - R0) < beta[uv]) && 
                    delta_r <= beta[uv] / 4 && delta_l <= beta[uv] / 4 && delta_m < alpha[uv]) {
                    p_src[-inc2] = (pel)((L2 * 3 + L1 * 8 + L0 * 3 + R0 * 2 + 8) >> 4);     // L1
                    p_src[inc] = (pel)((R2 * 3 + R1 * 8 + R0 * 3 + L0 * 2 + 8) >> 4);       // R1
                }
            }
        }
    }
}